

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infowin_init_data(Window dad,wchar_t x,wchar_t y,wchar_t w,wchar_t h,wchar_t b,Pixell fg,
                      Pixell bg)

{
  errr eVar1;
  Window xid_00;
  Window xid;
  wchar_t b_local;
  wchar_t h_local;
  wchar_t w_local;
  wchar_t y_local;
  wchar_t x_local;
  Window dad_local;
  
  memset(Infowin,0,0x28);
  _y_local = dad;
  if (dad == 0) {
    _y_local = Metadpy->root;
  }
  xid_00 = XCreateSimpleWindow(Metadpy->dpy,_y_local,x,y,w,h,b,fg,bg);
  XSelectInput(Metadpy->dpy,xid_00,0);
  Infowin->field_0x23 = Infowin->field_0x23 & 0xf7 | 8;
  eVar1 = Infowin_prepare(xid_00);
  return eVar1;
}

Assistant:

static errr Infowin_init_data(Window dad, int x, int y, int w, int h,
                              int b, Pixell fg, Pixell bg)
{
	Window xid;

	/* Wipe it clean */
	(void)memset(Infowin, 0, sizeof(infowin));


	/*** Error Check XXX ***/


	/*** Create the Window 'xid' from data ***/

	/* What happened here?  XXX XXX XXX */

	/* If no parent given, depend on root */
	if (dad == None)
		dad = Metadpy->root;

	/* Create the Window XXX Error Check */
	xid = XCreateSimpleWindow(Metadpy->dpy, dad, x, y, w, h, b, fg, bg);

	/* Start out selecting No events */
	XSelectInput(Metadpy->dpy, xid, 0L);

	/*** Prepare the new infowin ***/

	/* Mark it as nukable */
	Infowin->nuke = 1;

	/* Attempt to Initialize the infowin */
	return (Infowin_prepare(xid));
}